

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcDiscreteAccessoryType::~IfcDiscreteAccessoryType
          (IfcDiscreteAccessoryType *this,void **vtt)

{
  void **vtt_local;
  IfcDiscreteAccessoryType *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiscreteAccessoryType,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDiscreteAccessoryType,_0UL> *)
             &(this->super_IfcElementComponentType).super_IfcElementType.field_0x190,vtt + 0x28);
  IfcElementComponentType::~IfcElementComponentType(&this->super_IfcElementComponentType,vtt + 1);
  return;
}

Assistant:

IfcDiscreteAccessoryType() : Object("IfcDiscreteAccessoryType") {}